

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * __thiscall
google::protobuf::Arena::
AllocateInternal<google::protobuf::internal::MapFieldBase::ReflectionPayload,false>(Arena *this)

{
  void *pvVar1;
  
  pvVar1 = AllocateAlignedWithCleanup
                     (this,0x28,8,
                      internal::cleanup::
                      arena_destruct_object<google::protobuf::internal::MapFieldBase::ReflectionPayload>
                     );
  return pvVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE void* PROTOBUF_NONNULL AllocateInternal() {
    if (trivial) {
      return AllocateAligned(sizeof(T), alignof(T));
    } else {
      // We avoid instantiating arena_destruct_object<T> in the trivial case.
      constexpr auto dtor = &internal::cleanup::arena_destruct_object<
          std::conditional_t<trivial, std::string, T>>;
      return AllocateAlignedWithCleanup(sizeof(T), alignof(T), dtor);
    }
  }